

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

size_t remove_trailing_zeroes(char *str)

{
  ushort **ppuVar1;
  size_t sVar2;
  char *__s;
  char cVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar4 = (ulong)(*str == '-');
  if (str[uVar4 + 3] == '.') {
    cVar3 = str[uVar4 + 4];
    __s = str + uVar4 + 4;
    if (cVar3 == '\0') {
      pcVar5 = (char *)0x0;
    }
    else {
      ppuVar1 = __ctype_b_loc();
      pcVar5 = (char *)0x0;
      do {
        if ((*(byte *)((long)*ppuVar1 + (long)cVar3 * 2 + 1) & 0x10) == 0) break;
        if (cVar3 != '0') {
          pcVar5 = __s;
        }
        cVar3 = __s[1];
        __s = __s + 1;
      } while (cVar3 != '\0');
    }
    if (pcVar5 == (char *)0x0) {
      sVar2 = strlen(__s);
      memmove(str + uVar4 + 3,__s,sVar2 + 1);
      return (long)__s - (long)(str + uVar4 + 3);
    }
    pcVar5 = pcVar5 + 1;
    if (pcVar5 != __s) {
      sVar2 = strlen(__s);
      memmove(pcVar5,__s,sVar2 + 1);
      return (long)__s - (long)pcVar5;
    }
  }
  return 0;
}

Assistant:

static size_t remove_trailing_zeroes(char* str)
{
    // [-]0xh.hhhh00000000p±d -> [-]0xh.hhhhp±d
    // [-]0xh.00000000p±d -> [-]0xh±d
    if (*str == '-') { ++str; }
    assert(*str == '0'); { ++str; }
    assert(*str == 'x'); { ++str; }
    assert(isxdigit(*str)); { ++str; }
    size_t removed = 0;
    if(*str == '.')
    {
        char* point = str;
        { ++str; }
        char* last_non_0 = NULL;
        for(; *str && isxdigit(*str); ++str)
        {
            if(*str != '0')
                last_non_0 = str;
        }
        assert(*str == 'p');
        if(last_non_0)
        {
            if(last_non_0 + 1 != str) {
                removed = str - (last_non_0 + 1);
                memmove(last_non_0 + 1, str, strlen(str)+1);
            }
        }
        else
        {
            memmove(point, str, strlen(str)+1);
            removed = str - point;
        }
    }
    else {
        assert(*str == 'p');
    }
    return removed;
}